

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O1

void gen_lfqx(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGContext_conflict10 *pTVar1;
  uint uVar2;
  TCGTemp *pTVar3;
  TCGv_i64 arg;
  TCGContext_conflict10 *tcg_ctx;
  uintptr_t o_1;
  uintptr_t o;
  TCGv_i64 ret;
  uintptr_t o_5;
  TCGv_i64 val;
  uint uVar4;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar4 = ctx->opcode >> 0x15;
  if ((ctx->need_access_type == true) && (ctx->access_type != 0x30)) {
    tcg_gen_op2_ppc64(tcg_ctx_00,INDEX_op_movi_i32,(TCGArg)(cpu_access_type + (long)tcg_ctx_00),0x30
                     );
    ctx->access_type = 0x30;
  }
  pTVar3 = tcg_temp_new_internal_ppc64(tcg_ctx_00,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)pTVar3 - (long)tcg_ctx_00);
  pTVar3 = tcg_temp_new_internal_ppc64(tcg_ctx_00,TCG_TYPE_I64,false);
  val = (TCGv_i64)((long)pTVar3 - (long)tcg_ctx_00);
  pTVar1 = ctx->uc->tcg_ctx;
  uVar2 = ctx->opcode >> 0x10 & 0x1f;
  arg = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 8 & 0xf8));
  if (uVar2 == 0) {
    if (ctx->sf_mode != false) {
      if (arg != ret) {
        tcg_gen_op2_ppc64(pTVar1,INDEX_op_mov_i64,(TCGArg)(ret + (long)pTVar1),
                          (TCGArg)(arg + (long)pTVar1));
      }
      goto LAB_00b9bb66;
    }
  }
  else {
    tcg_gen_op3_ppc64(pTVar1,INDEX_op_add_i64,(TCGArg)(ret + (long)pTVar1),
                      (TCGArg)((long)&pTVar1->pool_cur + (long)cpu_gpr[uVar2]),
                      (TCGArg)(arg + (long)pTVar1));
    arg = ret;
    if (ctx->sf_mode != false) goto LAB_00b9bb66;
  }
  tcg_gen_ext32u_i64_ppc64(pTVar1,ret,arg);
LAB_00b9bb66:
  tcg_gen_qemu_ld_i64_ppc64
            (ctx->uc->tcg_ctx,val,ret,(long)ctx->mem_idx,ctx->default_tcg_memop_mask | MO_64);
  tcg_gen_op3_ppc64(tcg_ctx_00,INDEX_op_st_i64,(TCGArg)pTVar3,
                    (TCGArg)(tcg_ctx_00->cpu_env + (long)tcg_ctx_00),
                    (ulong)((uVar4 & 0x1f) << 4) + 0x12b28);
  pTVar1 = ctx->uc->tcg_ctx;
  tcg_gen_addi_i64_ppc64(pTVar1,ret,ret,8);
  if (ctx->sf_mode == false) {
    tcg_gen_ext32u_i64_ppc64(pTVar1,ret,ret);
  }
  tcg_gen_qemu_ld_i64_ppc64
            (ctx->uc->tcg_ctx,val,ret,(long)ctx->mem_idx,ctx->default_tcg_memop_mask | MO_64);
  tcg_gen_op3_ppc64(tcg_ctx_00,INDEX_op_st_i64,(TCGArg)pTVar3,
                    (TCGArg)(tcg_ctx_00->cpu_env + (long)tcg_ctx_00),
                    (ulong)((uVar4 * 0x10 + 0x10 & 0x1f0) + 0x12b28));
  tcg_temp_free_internal_ppc64(tcg_ctx_00,(TCGTemp *)(ret + (long)tcg_ctx_00));
  tcg_temp_free_internal_ppc64(tcg_ctx_00,(TCGTemp *)(val + (long)tcg_ctx_00));
  return;
}

Assistant:

static void gen_lfqx(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int rd = rD(ctx->opcode);
    TCGv t0;
    TCGv_i64 t1;
    gen_set_access_type(ctx, ACCESS_FLOAT);
    t0 = tcg_temp_new(tcg_ctx);
    t1 = tcg_temp_new_i64(tcg_ctx);
    gen_addr_reg_index(ctx, t0);
    gen_qemu_ld64_i64(ctx, t1, t0);
    set_fpr(tcg_ctx, rd, t1);
    gen_addr_add(ctx, t0, t0, 8);
    gen_qemu_ld64_i64(ctx, t1, t0);
    set_fpr(tcg_ctx, (rd + 1) % 32, t1);
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, t1);
}